

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O2

void __thiscall osqp::OsqpSettings::OsqpSettings(OsqpSettings *this)

{
  OSQPSettings osqp_settings;
  OSQPSettings local_c8;
  
  osqp_set_default_settings(&local_c8);
  this->rho = local_c8.rho;
  this->sigma = local_c8.sigma;
  this->scaling = local_c8.scaling;
  this->adaptive_rho = local_c8.adaptive_rho != 0;
  this->adaptive_rho_interval = local_c8.adaptive_rho_interval;
  this->adaptive_rho_tolerance = local_c8.adaptive_rho_tolerance;
  this->adaptive_rho_fraction = local_c8.adaptive_rho_fraction;
  this->max_iter = local_c8.max_iter;
  this->eps_abs = local_c8.eps_abs;
  this->eps_rel = local_c8.eps_rel;
  this->eps_prim_inf = local_c8.eps_prim_inf;
  this->eps_dual_inf = local_c8.eps_dual_inf;
  this->alpha = local_c8.alpha;
  this->delta = local_c8.delta;
  this->polish = local_c8.polish != 0;
  this->polish_refine_iter = local_c8.polish_refine_iter;
  this->verbose = local_c8.verbose != 0;
  this->scaled_termination = local_c8.scaled_termination != 0;
  this->check_termination = local_c8.check_termination;
  this->warm_start = local_c8.warm_start != 0;
  this->time_limit = local_c8.time_limit;
  return;
}

Assistant:

OsqpSettings::OsqpSettings() {
  ::OSQPSettings osqp_settings;
  osqp_set_default_settings(&osqp_settings);
  CopyFromInternalSettings(osqp_settings, this);
}